

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O2

void __thiscall QThreadPool::setThreadPriority(QThreadPool *this,Priority priority)

{
  QObjectData *pQVar1;
  long in_FS_OFFSET;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QObject).d_ptr.d;
  local_30._0_8_ = &pQVar1[1].children.d.size;
  local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBasicMutex::lock((QBasicMutex *)local_30._0_8_);
  local_30[8] = true;
  *(Priority *)((long)&pQVar1[3].parent + 4) = priority;
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QThreadPool::setThreadPriority(QThread::Priority priority)
{
    Q_D(QThreadPool);
    QMutexLocker locker(&d->mutex);
    d->threadPriority = priority;
}